

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_muxer_metadata.cc
# Opt level: O1

bool __thiscall SampleMuxerMetadata::Write(SampleMuxerMetadata *this,int64_t time_ns)

{
  bool bVar1;
  presentation_t pVar2;
  _Base_ptr p_Var3;
  byte unaff_BPL;
  _Self __tmp;
  const_iterator __position;
  
  __position._M_node = (this->cues_set_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)__position._M_node ==
        &(this->cues_set_)._M_t._M_impl.super__Rb_tree_header) {
      unaff_BPL = 1;
      break;
    }
    if ((time_ns < 0) ||
       (pVar2 = libwebvtt::Time::presentation((Time *)&__position._M_node[2]._M_parent),
       pVar2 * 1000000 - time_ns == 0 || pVar2 * 1000000 < time_ns)) {
      bVar1 = SortableCue::Write((SortableCue *)(__position._M_node + 1),this->segment_);
      if (bVar1) {
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
        std::
        _Rb_tree<SampleMuxerMetadata::SortableCue,_SampleMuxerMetadata::SortableCue,_std::_Identity<SampleMuxerMetadata::SortableCue>,_std::less<SampleMuxerMetadata::SortableCue>,_std::allocator<SampleMuxerMetadata::SortableCue>_>
        ::_M_erase_aux(&(this->cues_set_)._M_t,__position);
        bVar1 = true;
        __position._M_node = p_Var3;
      }
      else {
        puts("\nCould not add metadata.");
        bVar1 = false;
        unaff_BPL = 0;
      }
    }
    else {
      unaff_BPL = 1;
      bVar1 = false;
    }
  } while (bVar1);
  return (bool)(unaff_BPL & 1);
}

Assistant:

bool SampleMuxerMetadata::Write(int64_t time_ns) {
  typedef cues_set_t::iterator iter_t;

  iter_t i = cues_set_.begin();
  const iter_t j = cues_set_.end();

  while (i != j) {
    const cues_set_t::value_type& v = *i;

    if (time_ns >= 0 && v > time_ns)
      return true;  // nothing else to do just yet

    if (!v.Write(segment_)) {
      printf("\nCould not add metadata.\n");
      return false;  // error
    }

    cues_set_.erase(i++);
  }

  return true;
}